

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_go_struct_equals
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name)

{
  int *piVar1;
  t_type *type;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  t_type *ptVar5;
  pointer pptVar6;
  string *tgt_00;
  string goType;
  string src;
  string tgt;
  string field_name;
  string tgtv;
  string publicize_field_name;
  string srcv;
  string name;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  t_struct *local_1a0;
  pointer local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70;
  string local_50;
  
  local_1a0 = tstruct;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string(local_90,(string *)CONCAT44(extraout_var,iVar3));
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"func (p *");
  poVar4 = std::operator<<(poVar4,(string *)tstruct_name);
  poVar4 = std::operator<<(poVar4,") ");
  poVar4 = std::operator<<(poVar4,(string *)&this->equals_method_name_);
  poVar4 = std::operator<<(poVar4,"(other *");
  poVar4 = std::operator<<(poVar4,(string *)tstruct_name);
  poVar4 = std::operator<<(poVar4,") bool {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_1e0);
  poVar4 = std::operator<<(poVar4,"if p == other {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_1e0);
  poVar4 = std::operator<<(poVar4,"return true");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_1e0);
  poVar4 = std::operator<<(poVar4,"} else if p == nil || other == nil {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_1e0);
  poVar4 = std::operator<<(poVar4,"return false");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_1e0);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  pptVar6 = (local_1a0->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar6 ==
        (local_1a0->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_1e0);
      poVar4 = std::operator<<(poVar4,"return true");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1e0);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_1e0);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string(local_90);
      return;
    }
    std::__cxx11::string::_M_assign((string *)&local_150);
    type = (*pptVar6)->type_;
    publicize(&local_1e0,this,&local_150,false);
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_198 = pptVar6;
    bVar2 = is_pointer_field(*pptVar6,false);
    type_to_go_type_with_opt_abi_cxx11_(&local_1e0,this,type,bVar2);
    std::operator+(&local_170,"p.",&local_110);
    std::operator+(&local_190,"other.",&local_110);
    ptVar5 = t_type::get_true_type(type);
    bVar2 = is_pointer_field(*local_198,false);
    if (bVar2) {
      iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[5])(ptVar5);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[10])(ptVar5);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xd])(ptVar5);
          if ((char)iVar3 == '\0') goto LAB_001c55ca;
        }
      }
      std::operator+(&local_b0,"(*",&local_170);
      std::operator+(&local_130,&local_b0,")");
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator+(&local_1c0,"(*",&local_190);
      std::operator+(&local_b0,&local_1c0,")");
      std::__cxx11::string::~string((string *)&local_1c0);
      t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_1c0);
      poVar4 = std::operator<<(poVar4,"if ");
      poVar4 = std::operator<<(poVar4,(string *)&local_170);
      poVar4 = std::operator<<(poVar4," != ");
      poVar4 = std::operator<<(poVar4,(string *)&local_190);
      poVar4 = std::operator<<(poVar4," {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1c0);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_1c0);
      poVar4 = std::operator<<(poVar4,"if ");
      poVar4 = std::operator<<(poVar4,(string *)&local_170);
      poVar4 = std::operator<<(poVar4," == nil || ");
      poVar4 = std::operator<<(poVar4,(string *)&local_190);
      poVar4 = std::operator<<(poVar4," == nil {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1c0);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_1c0);
      poVar4 = std::operator<<(poVar4,"return false");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1c0);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_1c0);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::string((string *)&local_d0,(string *)&local_130);
      std::__cxx11::string::string((string *)&local_50,(string *)&local_b0);
      generate_go_equals(this,out,type,&local_d0,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_1c0);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_b0);
      tgt_00 = &local_130;
    }
    else {
LAB_001c55ca:
      std::__cxx11::string::string((string *)&local_f0,(string *)&local_170);
      std::__cxx11::string::string((string *)&local_70,(string *)&local_190);
      tgt_00 = &local_f0;
      generate_go_equals(this,out,type,tgt_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)tgt_00);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1e0);
    pptVar6 = local_198 + 1;
  } while( true );
}

Assistant:

void t_go_generator::generate_go_struct_equals(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name) {
  string name(tstruct->get_name());
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  indent(out) << "func (p *" << tstruct_name << ") " << equals_method_name_ << "(other *"
              << tstruct_name << ") bool {" << endl;
  indent_up();

  string field_name;
  string publicize_field_name;
  out << indent() << "if p == other {" << endl;
  indent_up();
  out << indent() << "return true" << endl;
  indent_down();
  out << indent() << "} else if p == nil || other == nil {" << endl;
  indent_up();
  out << indent() << "return false" << endl;
  indent_down();
  out << indent() << "}" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    field_name = (*f_iter)->get_name();
    t_type* field_type = (*f_iter)->get_type();
    publicize_field_name = publicize(field_name);
    string goType = type_to_go_type_with_opt(field_type, is_pointer_field(*f_iter));

    string tgt = "p." + publicize_field_name;
    string src = "other." + publicize_field_name;
    t_type* ttype = field_type->get_true_type();
    // Compare field contents
    if (is_pointer_field(*f_iter)
        && (ttype->is_base_type() || ttype->is_enum() || ttype->is_container())) {
      string tgtv = "(*" + tgt + ")";
      string srcv = "(*" + src + ")";
      out << indent() << "if " << tgt << " != " << src << " {" << endl;
      indent_up();
      out << indent() << "if " << tgt << " == nil || " << src << " == nil {" << endl;
      indent_up();
      out << indent() << "return false" << endl;
      indent_down();
      out << indent() << "}" << endl;
      generate_go_equals(out, field_type, tgtv, srcv);
      indent_down();
      out << indent() << "}" << endl;
    } else {
      generate_go_equals(out, field_type, tgt, src);
    }
  }
  out << indent() << "return true" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;
}